

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

TRef rec_mm_len(jit_State *J,TRef tr,TValue *tv)

{
  TRef *pTVar1;
  TValue *pTVar2;
  int iVar3;
  BCReg func;
  TRef extraout_EAX;
  RecordIndex ix;
  TValue local_60 [3];
  TValue local_48;
  TRef local_30;
  TRef local_20;
  
  local_60[0] = *tv;
  local_30 = tr;
  iVar3 = lj_record_mm_lookup(J,(RecordIndex *)&local_60[0].gcr,MM_FAST);
  if (iVar3 != 0) {
    func = rec_mm_prep(J,lj_cont_ra);
    pTVar1 = J->base;
    pTVar2 = J->L->base;
    pTVar1[func] = local_20;
    pTVar2[func] = local_48;
    pTVar1[(ulong)func + 2] = tr;
    pTVar2[(ulong)func + 2] = *tv;
    pTVar1[(ulong)func + 3] = 0x7fff;
    pTVar2[(ulong)func + 3].u64 = 0xffffffffffffffff;
    lj_record_call(J,func,2);
    return extraout_EAX;
  }
  lj_trace_err(J,LJ_TRERR_NOMM);
}

Assistant:

static TRef rec_mm_len(jit_State *J, TRef tr, TValue *tv)
{
  RecordIndex ix;
  ix.tab = tr;
  copyTV(J->L, &ix.tabv, tv);
  if (lj_record_mm_lookup(J, &ix, MM_len)) {
    BCReg func = rec_mm_prep(J, lj_cont_ra);
    TRef *base = J->base + func;
    TValue *basev = J->L->base + func;
    base[0] = ix.mobj; copyTV(J->L, basev+0, &ix.mobjv);
    base += LJ_FR2;
    basev += LJ_FR2;
    base[1] = tr; copyTV(J->L, basev+1, tv);
#if LJ_52
    base[2] = tr; copyTV(J->L, basev+2, tv);
#else
    base[2] = TREF_NIL; setnilV(basev+2);
#endif
    lj_record_call(J, func, 2);
  } else {
    if (LJ_52 && tref_istab(tr))
      return emitir(IRTI(IR_ALEN), tr, TREF_NIL);
    lj_trace_err(J, LJ_TRERR_NOMM);
  }
  return 0;  /* No result yet. */
}